

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termcolor.hpp
# Opt level: O0

ostream * termcolor::green(ostream *stream)

{
  bool bVar1;
  ostream *stream_local;
  
  bVar1 = _internal::is_colorized(stream);
  if (bVar1) {
    std::operator<<(stream,"\x1b[32m");
  }
  return stream;
}

Assistant:

inline
    std::ostream& green(std::ostream& stream)
    {
        if (_internal::is_colorized(stream))
        {
        #if defined(TERMCOLOR_OS_MACOS) || defined(TERMCOLOR_OS_LINUX)
            stream << "\033[32m";
        #elif defined(TERMCOLOR_OS_WINDOWS)
            _internal::win_change_attributes(stream,
                FOREGROUND_GREEN
            );
        #endif
        }
        return stream;
    }